

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

void __thiscall helics::BrokerBase::saveProfilingData(BrokerBase *this,string_view message)

{
  ProfilerBuffer *this_00;
  string_view name;
  allocator<char> local_41;
  string_view message_local;
  string local_30;
  
  message_local._M_str = message._M_str;
  message_local._M_len = message._M_len;
  this_00 = (this->prBuff).super___shared_ptr<helics::ProfilerBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 == (ProfilerBuffer *)0x0) {
    name._M_str = "[PROFILING]";
    name._M_len = 0xb;
    sendToLogger(this,(GlobalFederateId)0x0,2,name,message,false);
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_30,&message_local,&local_41);
    ProfilerBuffer::addMessage(this_00,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void BrokerBase::saveProfilingData(std::string_view message)
{
    if (prBuff) {
        prBuff->addMessage(std::string(message));
    } else {
        sendToLogger(parent_broker_id, LogLevels::PROFILING, "[PROFILING]", message);
    }
}